

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.hpp
# Opt level: O3

void __thiscall Experiments::Experiments(Experiments *this,int min,int max)

{
  double dVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  ulong uVar5;
  
  this->loops = 1000;
  (this->exps).super__Vector_base<Experiments::Node,_std::allocator<Experiments::Node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->exps).super__Vector_base<Experiments::Node,_std::allocator<Experiments::Node>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->exps).super__Vector_base<Experiments::Node,_std::allocator<Experiments::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dVar1 = log2((double)(max / min));
  iVar2 = (int)(dVar1 + 3.0);
  this->size = iVar2;
  uVar5 = 0xffffffffffffffff;
  if (-1 < iVar2) {
    uVar5 = (long)iVar2 * 4;
  }
  piVar3 = (int *)operator_new__(uVar5);
  this->buf_sizes = piVar3;
  iVar2 = min / 2;
  iVar4 = (max * 3) / 2;
  if (iVar4 < iVar2) {
    uVar5 = 0;
  }
  else {
    uVar5 = 0;
    do {
      piVar3[uVar5] = iVar2;
      uVar5 = uVar5 + 1;
      iVar2 = iVar2 * 2;
    } while (iVar2 <= iVar4);
    uVar5 = uVar5 & 0xffffffff;
  }
  piVar3[uVar5] = iVar4;
  this->buffer = (uint *)0x0;
  return;
}

Assistant:

Experiments::Experiments(int min, int max) {
    size = log2(max / min) + 3;
    buf_sizes = new int[size];
    int n = 0;
    min /= 2;
    while (min <= max * 3 / 2)
    {
        buf_sizes[n++] = min;
        min *= 2;
    }
    buf_sizes[n++] = max * 3 / 2;
    buffer = nullptr;
}